

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_playback_one_page(Pager *pPager,i64 *pOffset,Bitvec *pDone,int isMainJrnl,int isSavepnt)

{
  long lVar1;
  u8 *aData_00;
  bool bVar2;
  int iVar3;
  u32 uVar4;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  Pager *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  void *pData;
  i64 ofst;
  int isSynced;
  sqlite3_file *jfd;
  char *aData;
  int rc;
  u32 cksum;
  Pgno pgno;
  PgHdr *pPg;
  undefined4 in_stack_ffffffffffffff78;
  Pgno in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  Pager *pPager_00;
  Pager *in_stack_ffffffffffffff90;
  Bitvec *in_stack_ffffffffffffff98;
  int local_44;
  int local_1c;
  DbPage *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aData_00 = (u8 *)in_RDI->pTmpSpace;
  if (in_ECX == 0) {
    pPager_00 = (Pager *)in_RDI->sjfd;
  }
  else {
    pPager_00 = (Pager *)in_RDI->jfd;
  }
  local_1c = read32bits((sqlite3_file *)in_stack_ffffffffffffff90,(i64)pPager_00,
                        (u32 *)CONCAT17(in_stack_ffffffffffffff87,
                                        CONCAT16(in_stack_ffffffffffffff86,
                                                 CONCAT24(in_stack_ffffffffffffff84,
                                                          in_stack_ffffffffffffff80))));
  if ((local_1c == 0) &&
     (local_44 = sqlite3OsRead((sqlite3_file *)in_stack_ffffffffffffff90,pPager_00,
                               CONCAT13(in_stack_ffffffffffffff87,
                                        CONCAT12(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84
                                                )),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
     local_1c = local_44, local_44 == 0)) {
    *in_RSI = in_RDI->pageSize + 4 + (long)(in_ECX << 2) + *in_RSI;
    if (in_RDI->lckPgno == 0xaaaaaaaa) {
      local_1c = 0x65;
    }
    else if ((in_RDI->dbSize < 0xaaaaaaaa) ||
            (iVar3 = sqlite3BitvecTest((Bitvec *)
                                       CONCAT17(in_stack_ffffffffffffff87,
                                                CONCAT16(in_stack_ffffffffffffff86,
                                                         CONCAT24(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80))),
                                       in_stack_ffffffffffffff7c), iVar3 != 0)) {
      local_1c = 0;
    }
    else {
      if (in_ECX != 0) {
        local_44 = read32bits((sqlite3_file *)in_stack_ffffffffffffff90,(i64)pPager_00,
                              (u32 *)CONCAT17(in_stack_ffffffffffffff87,
                                              CONCAT16(in_stack_ffffffffffffff86,
                                                       CONCAT24(in_stack_ffffffffffffff84,
                                                                in_stack_ffffffffffffff80))));
        local_1c = local_44;
        if (local_44 != 0) goto LAB_00163df8;
        if ((in_R8D == 0) && (uVar4 = pager_cksum(in_RDI,aData_00), uVar4 != 0xaaaaaaaa)) {
          local_1c = 0x65;
          goto LAB_00163df8;
        }
      }
      if ((in_RDX == 0) ||
         (local_44 = sqlite3BitvecSet(in_stack_ffffffffffffff98,
                                      (u32)((ulong)in_stack_ffffffffffffff90 >> 0x20)),
         local_1c = local_44, local_44 == 0)) {
        if (in_RDI->pWal == (Wal *)0x0) {
          local_10 = sqlite3PagerLookup(pPager_00,
                                        CONCAT13(in_stack_ffffffffffffff87,
                                                 CONCAT12(in_stack_ffffffffffffff86,
                                                          in_stack_ffffffffffffff84)));
        }
        else {
          local_10 = (DbPage *)0x0;
        }
        if (in_ECX == 0) {
          in_stack_ffffffffffffff86 = true;
          bVar2 = (bool)in_stack_ffffffffffffff86;
          if (local_10 != (DbPage *)0x0) {
            in_stack_ffffffffffffff86 = (local_10->flags & 8) == 0;
            bVar2 = (bool)in_stack_ffffffffffffff86;
          }
        }
        else {
          in_stack_ffffffffffffff87 = true;
          bVar2 = (bool)in_stack_ffffffffffffff87;
          if (in_RDI->noSync == '\0') {
            in_stack_ffffffffffffff87 = *in_RSI <= in_RDI->journalHdr;
            bVar2 = (bool)in_stack_ffffffffffffff87;
          }
        }
        if ((in_RDI->fd->pMethods == (sqlite3_io_methods *)0x0) ||
           (((in_RDI->eState < 4 && (in_RDI->eState != '\0')) || (bVar2 == false)))) {
          if ((in_ECX == 0) && (local_10 == (DbPage *)0x0)) {
            in_RDI->doNotSpill = in_RDI->doNotSpill | 2;
            local_44 = sqlite3PagerGet(in_stack_ffffffffffffff90,(Pgno)((ulong)pPager_00 >> 0x20),
                                       (DbPage **)
                                       CONCAT17(in_stack_ffffffffffffff87,
                                                CONCAT16(in_stack_ffffffffffffff86,
                                                         CONCAT24(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80))),
                                       in_stack_ffffffffffffff7c);
            in_RDI->doNotSpill = in_RDI->doNotSpill & 0xfd;
            local_1c = local_44;
            if (local_44 != 0) goto LAB_00163df8;
            sqlite3PcacheMakeDirty((PgHdr *)0x163d6a);
          }
        }
        else {
          local_44 = sqlite3OsWrite((sqlite3_file *)in_stack_ffffffffffffff90,pPager_00,
                                    CONCAT13(in_stack_ffffffffffffff87,
                                             CONCAT12(in_stack_ffffffffffffff86,
                                                      in_stack_ffffffffffffff84)),
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (in_RDI->dbFileSize < 0xaaaaaaaa) {
            in_RDI->dbFileSize = 0xaaaaaaaa;
          }
          if (in_RDI->pBackup != (sqlite3_backup *)0x0) {
            sqlite3BackupUpdate((sqlite3_backup *)
                                CONCAT17(in_stack_ffffffffffffff87,
                                         CONCAT16(in_stack_ffffffffffffff86,
                                                  CONCAT24(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80))),
                                in_stack_ffffffffffffff7c,(u8 *)0x163d01);
          }
        }
        if (local_10 != (DbPage *)0x0) {
          memcpy(local_10->pData,aData_00,in_RDI->pageSize);
          (*in_RDI->xReiniter)(local_10);
          sqlite3PcacheRelease((PgHdr *)0x163df0);
        }
        local_1c = local_44;
      }
    }
  }
LAB_00163df8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

static int pager_playback_one_page(
  Pager *pPager,                /* The pager being played back */
  i64 *pOffset,                 /* Offset of record to playback */
  Bitvec *pDone,                /* Bitvec of pages already played back */
  int isMainJrnl,               /* 1 -> main journal. 0 -> sub-journal. */
  int isSavepnt                 /* True for a savepoint rollback */
){
  int rc;
  PgHdr *pPg;                   /* An existing page in the cache */
  Pgno pgno;                    /* The page number of a page in journal */
  u32 cksum;                    /* Checksum used for sanity checking */
  char *aData;                  /* Temporary storage for the page */
  sqlite3_file *jfd;            /* The file descriptor for the journal file */
  int isSynced;                 /* True if journal page is synced */

  assert( (isMainJrnl&~1)==0 );      /* isMainJrnl is 0 or 1 */
  assert( (isSavepnt&~1)==0 );       /* isSavepnt is 0 or 1 */
  assert( isMainJrnl || pDone );     /* pDone always used on sub-journals */
  assert( isSavepnt || pDone==0 );   /* pDone never used on non-savepoint */

  aData = pPager->pTmpSpace;
  assert( aData );         /* Temp storage must have already been allocated */
  assert( pagerUseWal(pPager)==0 || (!isMainJrnl && isSavepnt) );

  /* Either the state is greater than PAGER_WRITER_CACHEMOD (a transaction
  ** or savepoint rollback done at the request of the caller) or this is
  ** a hot-journal rollback. If it is a hot-journal rollback, the pager
  ** is in state OPEN and holds an EXCLUSIVE lock. Hot-journal rollback
  ** only reads from the main journal, not the sub-journal.
  */
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD
       || (pPager->eState==PAGER_OPEN && pPager->eLock==EXCLUSIVE_LOCK)
  );
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD || isMainJrnl );

  /* Read the page number and page data from the journal or sub-journal
  ** file. Return an error code to the caller if an IO error occurs.
  */
  jfd = isMainJrnl ? pPager->jfd : pPager->sjfd;
  rc = read32bits(jfd, *pOffset, &pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsRead(jfd, (u8*)aData, pPager->pageSize, (*pOffset)+4);
  if( rc!=SQLITE_OK ) return rc;
  *pOffset += pPager->pageSize + 4 + isMainJrnl*4;

  /* Sanity checking on the page.  This is more important that I originally
  ** thought.  If a power failure occurs while the journal is being written,
  ** it could cause invalid data to be written into the journal.  We need to
  ** detect this invalid data (with high probability) and ignore it.
  */
  if( pgno==0 || pgno==PAGER_SJ_PGNO(pPager) ){
    assert( !isSavepnt );
    return SQLITE_DONE;
  }
  if( pgno>(Pgno)pPager->dbSize || sqlite3BitvecTest(pDone, pgno) ){
    return SQLITE_OK;
  }
  if( isMainJrnl ){
    rc = read32bits(jfd, (*pOffset)-4, &cksum);
    if( rc ) return rc;
    if( !isSavepnt && pager_cksum(pPager, (u8*)aData)!=cksum ){
      return SQLITE_DONE;
    }
  }

  /* If this page has already been played back before during the current
  ** rollback, then don't bother to play it back again.
  */
  if( pDone && (rc = sqlite3BitvecSet(pDone, pgno))!=SQLITE_OK ){
    return rc;
  }

  /* When playing back page 1, restore the nReserve setting
  */
  if( pgno==1 && pPager->nReserve!=((u8*)aData)[20] ){
    pPager->nReserve = ((u8*)aData)[20];
  }

  /* If the pager is in CACHEMOD state, then there must be a copy of this
  ** page in the pager cache. In this case just update the pager cache,
  ** not the database file. The page is left marked dirty in this case.
  **
  ** An exception to the above rule: If the database is in no-sync mode
  ** and a page is moved during an incremental vacuum then the page may
  ** not be in the pager cache. Later: if a malloc() or IO error occurs
  ** during a Movepage() call, then the page may not be in the cache
  ** either. So the condition described in the above paragraph is not
  ** assert()able.
  **
  ** If in WRITER_DBMOD, WRITER_FINISHED or OPEN state, then we update the
  ** pager cache if it exists and the main file. The page is then marked
  ** not dirty. Since this code is only executed in PAGER_OPEN state for
  ** a hot-journal rollback, it is guaranteed that the page-cache is empty
  ** if the pager is in OPEN state.
  **
  ** Ticket #1171:  The statement journal might contain page content that is
  ** different from the page content at the start of the transaction.
  ** This occurs when a page is changed prior to the start of a statement
  ** then changed again within the statement.  When rolling back such a
  ** statement we must not write to the original database unless we know
  ** for certain that original page contents are synced into the main rollback
  ** journal.  Otherwise, a power loss might leave modified data in the
  ** database file without an entry in the rollback journal that can
  ** restore the database to its original form.  Two conditions must be
  ** met before writing to the database files. (1) the database must be
  ** locked.  (2) we know that the original page content is fully synced
  ** in the main journal either because the page is not in cache or else
  ** the page is marked as needSync==0.
  **
  ** 2008-04-14:  When attempting to vacuum a corrupt database file, it
  ** is possible to fail a statement on a database that does not yet exist.
  ** Do not attempt to write if database file has never been opened.
  */
  if( pagerUseWal(pPager) ){
    pPg = 0;
  }else{
    pPg = sqlite3PagerLookup(pPager, pgno);
  }
  assert( pPg || !MEMDB );
  assert( pPager->eState!=PAGER_OPEN || pPg==0 || pPager->tempFile );
  PAGERTRACE(("PLAYBACK %d page %d hash(%08x) %s\n",
           PAGERID(pPager), pgno, pager_datahash(pPager->pageSize, (u8*)aData),
           (isMainJrnl?"main-journal":"sub-journal")
  ));
  if( isMainJrnl ){
    isSynced = pPager->noSync || (*pOffset <= pPager->journalHdr);
  }else{
    isSynced = (pPg==0 || 0==(pPg->flags & PGHDR_NEED_SYNC));
  }
  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
   && isSynced
  ){
    i64 ofst = (pgno-1)*(i64)pPager->pageSize;
    testcase( !isSavepnt && pPg!=0 && (pPg->flags&PGHDR_NEED_SYNC)!=0 );
    assert( !pagerUseWal(pPager) );

    /* Write the data read from the journal back into the database file.
    ** This is usually safe even for an encrypted database - as the data
    ** was encrypted before it was written to the journal file. The exception
    ** is if the data was just read from an in-memory sub-journal. In that
    ** case it must be encrypted here before it is copied into the database
    ** file.  */
    rc = sqlite3OsWrite(pPager->fd, (u8 *)aData, pPager->pageSize, ofst);

    if( pgno>pPager->dbFileSize ){
      pPager->dbFileSize = pgno;
    }
    if( pPager->pBackup ){
      sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)aData);
    }
  }else if( !isMainJrnl && pPg==0 ){
    /* If this is a rollback of a savepoint and data was not written to
    ** the database and the page is not in-memory, there is a potential
    ** problem. When the page is next fetched by the b-tree layer, it
    ** will be read from the database file, which may or may not be
    ** current.
    **
    ** There are a couple of different ways this can happen. All are quite
    ** obscure. When running in synchronous mode, this can only happen
    ** if the page is on the free-list at the start of the transaction, then
    ** populated, then moved using sqlite3PagerMovepage().
    **
    ** The solution is to add an in-memory page to the cache containing
    ** the data just read from the sub-journal. Mark the page as dirty
    ** and if the pager requires a journal-sync, then mark the page as
    ** requiring a journal-sync before it is written.
    */
    assert( isSavepnt );
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)==0 );
    pPager->doNotSpill |= SPILLFLAG_ROLLBACK;
    rc = sqlite3PagerGet(pPager, pgno, &pPg, 1);
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)!=0 );
    pPager->doNotSpill &= ~SPILLFLAG_ROLLBACK;
    if( rc!=SQLITE_OK ) return rc;
    sqlite3PcacheMakeDirty(pPg);
  }
  if( pPg ){
    /* No page should ever be explicitly rolled back that is in use, except
    ** for page 1 which is held in use in order to keep the lock on the
    ** database active. However such a page may be rolled back as a result
    ** of an internal error resulting in an automatic call to
    ** sqlite3PagerRollback().
    */
    void *pData;
    pData = pPg->pData;
    memcpy(pData, (u8*)aData, pPager->pageSize);
    pPager->xReiniter(pPg);
    /* It used to be that sqlite3PcacheMakeClean(pPg) was called here.  But
    ** that call was dangerous and had no detectable benefit since the cache
    ** is normally cleaned by sqlite3PcacheCleanAll() after rollback and so
    ** has been removed. */
    pager_set_pagehash(pPg);

    /* If this was page 1, then restore the value of Pager.dbFileVers.
    ** Do this before any decoding. */
    if( pgno==1 ){
      memcpy(&pPager->dbFileVers, &((u8*)pData)[24],sizeof(pPager->dbFileVers));
    }
    sqlite3PcacheRelease(pPg);
  }
  return rc;
}